

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O0

void __thiscall ValueInfo::SetSymStore(ValueInfo *this,Sym *sym)

{
  code *pcVar1;
  bool bVar2;
  StackSym *this_00;
  undefined4 *puVar3;
  Sym *sym_local;
  ValueInfo *this_local;
  
  if ((sym != (Sym *)0x0) && (bVar2 = Sym::IsPropertySym(sym), !bVar2)) {
    this_00 = Sym::AsStackSym(sym);
    bVar2 = StackSym::IsTypeSpec(this_00);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
                         ,0xff,
                         "(sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec())"
                         ,
                         "sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  this->symStore = sym;
  return;
}

Assistant:

void                    SetSymStore(Sym * sym)
    {
        // Sym store should always be a var sym
        Assert(sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec()); // property syms always have a var stack sym
        this->symStore = sym;
    }